

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<16,Blob<128>>
               (hashfunc<Blob<128>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  pfHash p_Var2;
  size_type sVar3;
  byte in_CL;
  uint in_EDX;
  char *pcVar4;
  uint in_ESI;
  byte in_R8B;
  byte in_R9B;
  bool result;
  Blob<128> h;
  keytype k;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> hashes;
  bool in_stack_0000009b;
  bool in_stack_0000009c;
  bool in_stack_0000009d;
  bool in_stack_0000009e;
  bool in_stack_0000009f;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_stack_000000a0;
  undefined3 uVar5;
  undefined4 in_stack_ffffffffffffffb0;
  byte bVar7;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffffb4;
  Blob<16> *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc7;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  pfHash in_stack_ffffffffffffffd0;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = (byte)in_EDX & 1;
  local_e = in_CL & 1;
  local_f = in_R8B & 1;
  local_10 = in_R9B & 1;
  pcVar4 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar4 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x10,pcVar4,(ulong)in_ESI);
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::vector
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)0x1593b1);
  Blob<16>::Blob((Blob<16> *)&stack0xffffffffffffffd6);
  memset(&stack0xffffffffffffffd6,0,2);
  if ((local_d & 1) != 0) {
    Blob<128>::Blob((Blob<128> *)&stack0xffffffffffffffb4);
    p_Var2 = hashfunc::operator_cast_to_function_pointer(local_8);
    (*p_Var2)(&stack0xffffffffffffffd6,2,0,&stack0xffffffffffffffb4);
    std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::push_back
              ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (value_type *)CONCAT44(in_ESI,in_EDX));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<16>,Blob<128>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
             (bool)in_stack_ffffffffffffffc7,in_stack_ffffffffffffffb8,
             (vector<Blob<128>,_std::allocator<Blob<128>_>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  sVar3 = std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::size(&local_28);
  printf("%d keys\n",sVar3 & 0xffffffff);
  uVar5 = (undefined3)in_stack_ffffffffffffffb0;
  bVar7 = 1;
  bVar1 = TestHashList<Blob<128>>
                    (in_stack_000000a0,in_stack_0000009f,in_stack_0000009e,in_stack_0000009d,
                     in_stack_0000009c,in_stack_0000009b);
  uVar6 = CONCAT13(bVar1 & bVar7,uVar5);
  printf("\n");
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::~vector
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,uVar6));
  return (bool)((byte)((uint)uVar6 >> 0x18) & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}